

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
          (InternalMetadata *this)

{
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  Arena *arena;
  
  arena = (Arena *)this->ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pCVar1 = Arena::
           Create<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                     (arena);
  this->ptr_ = (ulong)pCVar1 | 1;
  (pCVar1->super_ContainerBase).arena = arena;
  return &pCVar1->unknown_fields;
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container<T>* container = Arena::Create<Container<T>>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = reinterpret_cast<intptr_t>(container);
    ptr_ |= kUnknownFieldsTagMask;
    container->arena = my_arena;
    return &(container->unknown_fields);
  }